

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_concat(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  bson_t expected;
  bson_t bcon;
  bson_t child2;
  bson_t child;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [4];
  uint local_27c;
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  bson_init(local_280);
  bson_init(local_300);
  bson_init(local_180);
  bson_init(local_200);
  bson_append_utf8(local_180,"hello",0xffffffff,"world",0xffffffff);
  bson_append_document(local_300,"foo",0xffffffff,local_180);
  uVar3 = bson_bcon_magic();
  bcon_append(local_280,"foo","{",uVar3,0x15,local_180,"}",0);
  pvVar4 = (void *)bson_get_data(local_280);
  pvVar5 = (void *)bson_get_data(local_300);
  if (local_2fc == local_27c) {
    pvVar6 = (void *)bson_get_data(local_300);
    pvVar7 = (void *)bson_get_data(local_280);
    iVar1 = bcmp(pvVar6,pvVar7,(ulong)local_2fc);
    if (iVar1 == 0) {
      bson_reinit(local_280);
      bson_reinit(local_300);
      bson_reinit(local_180);
      bson_append_utf8(local_180,"0",0xffffffff,"bar",0xffffffff);
      bson_append_utf8(local_180,"1",0xffffffff,"baz",0xffffffff);
      bson_append_array(local_300,"foo",0xffffffff,local_180);
      bson_append_utf8(local_200,"0",0xffffffff,"baz",0xffffffff);
      bcon_append(local_280,"foo","[","bar",uVar3,0x15,local_200,"]",0);
      pvVar4 = (void *)bson_get_data(local_280);
      pvVar5 = (void *)bson_get_data(local_300);
      if (local_2fc == local_27c) {
        pvVar6 = (void *)bson_get_data(local_300);
        pvVar7 = (void *)bson_get_data(local_280);
        iVar1 = bcmp(pvVar6,pvVar7,(ulong)local_2fc);
        if (iVar1 == 0) {
          bson_destroy(local_280);
          bson_destroy(local_180);
          bson_destroy(local_200);
          bson_destroy(local_300);
          return;
        }
      }
      uVar3 = bson_as_canonical_extended_json(local_280,0);
      uVar8 = bson_as_canonical_extended_json(local_300,0);
      uVar12 = 0;
      uVar10 = local_2fc;
      if (local_27c < local_2fc) {
        uVar12 = 0;
        uVar10 = local_27c;
      }
      for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        if (*(char *)((long)pvVar4 + (ulong)uVar12) != *(char *)((long)pvVar5 + (ulong)uVar12))
        goto LAB_00132d36;
      }
      uVar12 = local_27c;
      if (local_27c < local_2fc) {
        uVar12 = local_2fc;
      }
      uVar12 = uVar12 - 1;
LAB_00132d36:
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar12,uVar3,uVar8);
      iVar1 = open("failure.bad.bson",0x42,0x1a0);
      iVar2 = open("failure.expected.bson",0x42,0x1a0);
      if (iVar1 == -1) {
        pcVar11 = "fd1 != -1";
      }
      else if (iVar2 == -1) {
        pcVar11 = "fd2 != -1";
      }
      else {
        uVar9 = write(iVar1,pvVar4,(ulong)local_27c);
        if (uVar9 == local_27c) {
          uVar9 = write(iVar2,pvVar5,(ulong)local_2fc);
          if (uVar9 == local_2fc) {
            close(iVar1);
            close(iVar2);
            pcVar11 = "0";
          }
          else {
            pcVar11 = "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)";
          }
        }
        else {
          pcVar11 = "(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)";
        }
      }
      uVar3 = 0x21c;
      goto LAB_00132e1c;
    }
  }
  uVar3 = bson_as_canonical_extended_json(local_280,0);
  uVar8 = bson_as_canonical_extended_json(local_300,0);
  uVar12 = 0;
  uVar10 = local_2fc;
  if (local_27c < local_2fc) {
    uVar12 = 0;
    uVar10 = local_27c;
  }
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    if (*(char *)((long)pvVar4 + (ulong)uVar12) != *(char *)((long)pvVar5 + (ulong)uVar12))
    goto LAB_00132c46;
  }
  uVar12 = local_27c;
  if (local_27c < local_2fc) {
    uVar12 = local_2fc;
  }
  uVar12 = uVar12 - 1;
LAB_00132c46:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar12,uVar3,uVar8);
  iVar1 = open("failure.bad.bson",0x42,0x1a0);
  iVar2 = open("failure.expected.bson",0x42,0x1a0);
  if (iVar1 == -1) {
    pcVar11 = "fd1 != -1";
  }
  else if (iVar2 == -1) {
    pcVar11 = "fd2 != -1";
  }
  else {
    uVar9 = write(iVar1,pvVar4,(ulong)local_27c);
    if (uVar9 == local_27c) {
      uVar9 = write(iVar2,pvVar5,(ulong)local_2fc);
      if (uVar9 == local_2fc) {
        close(iVar1);
        close(iVar2);
        pcVar11 = "0";
      }
      else {
        pcVar11 = "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)";
      }
    }
    else {
      pcVar11 = "(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)";
    }
  }
  uVar3 = 0x20f;
LAB_00132e1c:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
          ,uVar3,"test_concat",pcVar11);
  abort();
}

Assistant:

static void
test_concat (void)
{
   bson_t bcon, expected, child, child2;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);
   bson_init (&child2);

   bson_append_utf8 (&child, "hello", -1, "world", -1);
   bson_append_document (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "{", BCON (&child), "}");

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);
   bson_reinit (&child);

   bson_append_utf8 (&child, "0", -1, "bar", -1);
   bson_append_utf8 (&child, "1", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   bson_append_utf8 (&child2, "0", -1, "baz", -1);
   BCON_APPEND (&bcon, "foo", "[", "bar", BCON (&child2), "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&child2);
   bson_destroy (&expected);
}